

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::output_diagram(Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
                 *this,ostream *ostream)

{
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *pBVar1;
  cmp_intervals_by_length this_00;
  bool bVar2;
  uint uVar3;
  iterator __first;
  iterator __last;
  reference ptVar4;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var5;
  ostream *poVar6;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var7;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long,_int>_> *p_Var8;
  Filtration_value FVar9;
  undefined1 local_68 [8];
  tuple<unsigned_long,_unsigned_long,_int> pair;
  iterator __end0;
  iterator __begin0;
  vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  *__range3;
  cmp_intervals_by_length local_20;
  cmp_intervals_by_length cmp;
  ostream *ostream_local;
  Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  cmp.sc_ = (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *)
            ostream;
  cmp_intervals_by_length::cmp_intervals_by_length(&local_20,this->cpx_);
  __first = std::
            begin<std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>
                      (&this->persistent_pairs_);
  __last = std::
           end<std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>
                     (&this->persistent_pairs_);
  std::
  sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,int>*,std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>,Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>
            ((__normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
              )__last._M_current,local_20);
  __end0 = std::
           vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
           ::begin(&this->persistent_pairs_);
  pair.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
       ::end(&this->persistent_pairs_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
                                *)&pair.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
                                   super__Head_base<0UL,_unsigned_long,_false>);
    if (!bVar2) break;
    ptVar4 = __gnu_cxx::
             __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
             ::operator*(&__end0);
    this_00 = cmp;
    local_68._0_4_ =
         (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
         super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
         super__Head_base<2UL,_int,_false>;
    local_68._4_4_ =
         *(undefined4 *)
          &(ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
           super__Tuple_impl<1UL,_unsigned_long,_int>.field_0x4;
    pair.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
    super__Tuple_impl<1UL,_unsigned_long,_int>._0_8_ =
         (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
         super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
         _M_head_impl;
    pair.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>.
    super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
    _M_head_impl = (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
                   super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    p_Var5 = std::get<2ul,unsigned_long,unsigned_long,int>
                       ((tuple<unsigned_long,_unsigned_long,_int> *)local_68);
    poVar6 = (ostream *)std::ostream::operator<<(this_00.sc_,*p_Var5);
    poVar6 = std::operator<<(poVar6,"  ");
    pBVar1 = this->cpx_;
    p_Var7 = std::get<0ul,unsigned_long,unsigned_long,int>
                       ((tuple<unsigned_long,_unsigned_long,_int> *)local_68);
    uVar3 = cubical_complex::
            Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
            dimension(pBVar1,*p_Var7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
    poVar6 = std::operator<<(poVar6," ");
    pBVar1 = this->cpx_;
    p_Var7 = std::get<0ul,unsigned_long,unsigned_long,int>
                       ((tuple<unsigned_long,_unsigned_long,_int> *)local_68);
    FVar9 = cubical_complex::
            Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
            filtration(pBVar1,*p_Var7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,FVar9);
    poVar6 = std::operator<<(poVar6," ");
    pBVar1 = this->cpx_;
    p_Var8 = std::get<1ul,unsigned_long,unsigned_long,int>
                       ((tuple<unsigned_long,_unsigned_long,_int> *)local_68);
    FVar9 = cubical_complex::
            Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
            filtration(pBVar1,*p_Var8);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,FVar9);
    poVar6 = std::operator<<(poVar6," ");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void output_diagram(std::ostream& ostream = std::cout) {
    cmp_intervals_by_length cmp(cpx_);
    std::sort(std::begin(persistent_pairs_), std::end(persistent_pairs_), cmp);
    for (auto pair : persistent_pairs_) {
      ostream << get<2>(pair) << "  " << cpx_->dimension(get<0>(pair)) << " "
        << cpx_->filtration(get<0>(pair)) << " "
        << cpx_->filtration(get<1>(pair)) << " " << std::endl;
    }
  }